

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

void __thiscall QDockWidget::QDockWidget(QDockWidget *this,QWidget *parent,WindowFlags flags)

{
  QDockWidgetPrivate *this_00;
  
  this_00 = (QDockWidgetPrivate *)operator_new(0x2c8);
  QDockWidgetPrivate::QDockWidgetPrivate(this_00);
  QWidget::QWidget(&this->super_QWidget,(QWidgetPrivate *)this_00,parent,flags);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_007cc410;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QDockWidget_007cc5c8;
  QDockWidgetPrivate::init
            (*(QDockWidgetPrivate **)&(this->super_QWidget).field_0x8,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

QDockWidget::QDockWidget(QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QDockWidgetPrivate, parent, flags)
{
    Q_D(QDockWidget);
    d->init();
}